

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFG.cpp
# Opt level: O1

vector<Production_*,_std::allocator<Production_*>_> * __thiscall
CFG::removeDoubleProductions
          (vector<Production_*,_std::allocator<Production_*>_> *__return_storage_ptr__,CFG *this,
          vector<Production_*,_std::allocator<Production_*>_> *productions)

{
  pointer ppPVar1;
  bool bVar2;
  pointer ppPVar3;
  Production *prod;
  Production *local_28;
  
  (__return_storage_ptr__->super__Vector_base<Production_*,_std::allocator<Production_*>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Production_*,_std::allocator<Production_*>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Production_*,_std::allocator<Production_*>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ppPVar1 = (productions->super__Vector_base<Production_*,_std::allocator<Production_*>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppPVar3 = (productions->super__Vector_base<Production_*,_std::allocator<Production_*>_>).
                 _M_impl.super__Vector_impl_data._M_start; ppPVar3 != ppPVar1; ppPVar3 = ppPVar3 + 1
      ) {
    local_28 = *ppPVar3;
    bVar2 = inVector(local_28,__return_storage_ptr__);
    if (!bVar2) {
      std::vector<Production*,std::allocator<Production*>>::emplace_back<Production*&>
                ((vector<Production*,std::allocator<Production*>> *)__return_storage_ptr__,&local_28
                );
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<Production *> CFG::removeDoubleProductions(std::vector<Production *> productions) {
    std::vector<Production *> newProductions = {};
    for (auto prod: productions) {
        if (!inVector(prod, newProductions)) {
            newProductions.emplace_back(prod);
        }
    }
    return newProductions;
}